

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall astar::Map::Map(Map *this,int w,int h)

{
  ulong __n;
  allocator_type local_4e;
  allocator_type local_4d;
  value_type_conflict1 local_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_30;
  
  (this->map).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->map).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->map).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (h < 1) {
    h = 0;
  }
  this->n = h;
  __n = (ulong)(uint)w;
  if (w < 1) {
    __n = 0;
  }
  this->m = (int)__n;
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,&local_4c,&local_4d);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_30,(ulong)(uint)h,(value_type *)&local_48,&local_4e);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(&this->map,&local_30);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

Map::Map(int w, int h)
{
    n = h;
    m = w;
    n = (n > 0 ? n : 0);
    m = (m > 0 ? m : 0);
    this->map = std::vector<std::vector<int>>(n, std::vector<int>(m, 0));
}